

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O0

array<cv::RotatedRect,_10UL> *
ellipses::compute_final_ellipses_by_linear_interpolation
          (array<cv::RotatedRect,_10UL> *__return_storage_ptr__,
          array<cv::RotatedRect,_3UL> *ellipses,size_t ignored_index)

{
  size_type sVar1;
  double dVar2;
  long lVar3;
  const_reference pvVar4;
  double dVar5;
  reference this;
  undefined4 uVar6;
  undefined4 uVar23;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  RotatedRect *local_128;
  RotatedRect local_120;
  float local_10c;
  float angle;
  Size2f size;
  Point2f center;
  double x;
  size_t i_1;
  double centery_constant;
  double centery_coef;
  double centerx_constant;
  double centerx_coef;
  double angle_constant;
  double angle_coef;
  double width_constant;
  double width_coef;
  double height_constant;
  double height_coef;
  double x_square;
  size_t i;
  double x_centery_sum;
  double centery_sum;
  double x_centerx_sum;
  double centerx_sum;
  double x_angle_sum;
  double angle_sum;
  double x_width_sum;
  double width_sum;
  double x_height_sum;
  double height_sum;
  double x_x_sum;
  double x_sum;
  size_type sample_size;
  size_t ignored_index_local;
  array<cv::RotatedRect,_3UL> *ellipses_local;
  array<cv::RotatedRect,_10UL> *result;
  undefined1 auVar16 [16];
  
  memset(__return_storage_ptr__,0,200);
  local_128 = __return_storage_ptr__->_M_elems;
  do {
    cv::RotatedRect::RotatedRect(local_128);
    local_128 = local_128 + 1;
  } while (local_128 != __return_storage_ptr__[1]._M_elems);
  x_sum = (double)std::array<cv::RotatedRect,_3UL>::size(ellipses);
  sVar1 = std::array<cv::RotatedRect,_3UL>::size(ellipses);
  if (ignored_index < sVar1) {
    x_sum = (double)((long)x_sum - 1);
  }
  i = 0;
  x_centery_sum = 0.0;
  centery_sum = 0.0;
  x_centerx_sum = 0.0;
  centerx_sum = 0.0;
  x_angle_sum = 0.0;
  angle_sum = 0.0;
  x_width_sum = 0.0;
  width_sum = 0.0;
  x_height_sum = 0.0;
  height_sum = 0.0;
  x_x_sum = 0.0;
  x_square = 0.0;
  while( true ) {
    dVar2 = (double)std::array<cv::RotatedRect,_3UL>::size(ellipses);
    if ((ulong)dVar2 <= (ulong)x_square) break;
    if (x_square != (double)ignored_index) {
      uVar23 = (undefined4)((ulong)x_square >> 0x20);
      auVar30._8_4_ = uVar23;
      auVar30._0_8_ = x_square;
      auVar30._12_4_ = 0x45300000;
      uVar6 = SUB84(x_square,0);
      x_x_sum = x_x_sum + (auVar30._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0);
      lVar3 = (long)x_square * (long)x_square;
      auVar24._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar24._0_8_ = lVar3;
      auVar24._12_4_ = 0x45300000;
      height_sum = height_sum +
                   (auVar24._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      x_height_sum = x_height_sum + (double)(pvVar4->size).height;
      auVar11._8_4_ = uVar23;
      auVar11._0_8_ = x_square;
      auVar11._12_4_ = 0x45300000;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      width_sum = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) *
                  (double)(pvVar4->size).height + width_sum;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      x_width_sum = x_width_sum + (double)(pvVar4->size).width;
      auVar12._8_4_ = uVar23;
      auVar12._0_8_ = x_square;
      auVar12._12_4_ = 0x45300000;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      angle_sum = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) *
                  (double)(pvVar4->size).width + angle_sum;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      x_angle_sum = x_angle_sum + (double)pvVar4->angle;
      auVar13._8_4_ = uVar23;
      auVar13._0_8_ = x_square;
      auVar13._12_4_ = 0x45300000;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      centerx_sum = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) *
                    (double)pvVar4->angle + centerx_sum;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      x_centerx_sum = x_centerx_sum + (double)(pvVar4->center).x;
      auVar14._8_4_ = uVar23;
      auVar14._0_8_ = x_square;
      auVar14._12_4_ = 0x45300000;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      centery_sum = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) *
                    (double)(pvVar4->center).x + centery_sum;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      x_centery_sum = x_centery_sum + (double)(pvVar4->center).y;
      auVar15._8_4_ = uVar23;
      auVar15._0_8_ = x_square;
      auVar15._12_4_ = 0x45300000;
      pvVar4 = std::array<cv::RotatedRect,_3UL>::operator[](ellipses,(size_type)x_square);
      i = (size_t)(((auVar15._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) *
                   (double)(pvVar4->center).y + (double)i);
    }
    x_square = (double)((long)x_square + 1);
  }
  uVar23 = (undefined4)((ulong)x_sum >> 0x20);
  auVar16._8_4_ = uVar23;
  auVar16._0_8_ = x_sum;
  auVar16._12_4_ = 0x45300000;
  uVar6 = SUB84(x_sum,0);
  dVar7 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * height_sum -
          x_x_sum * x_x_sum;
  auVar17._8_4_ = uVar23;
  auVar17._0_8_ = x_sum;
  auVar17._12_4_ = 0x45300000;
  dVar2 = (((auVar17._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * width_sum -
          x_x_sum * x_height_sum) / dVar7;
  auVar25._8_4_ = uVar23;
  auVar25._0_8_ = x_sum;
  auVar25._12_4_ = 0x45300000;
  auVar18._8_4_ = uVar23;
  auVar18._0_8_ = x_sum;
  auVar18._12_4_ = 0x45300000;
  dVar8 = (((auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * angle_sum -
          x_x_sum * x_width_sum) / dVar7;
  auVar26._8_4_ = uVar23;
  auVar26._0_8_ = x_sum;
  auVar26._12_4_ = 0x45300000;
  auVar19._8_4_ = uVar23;
  auVar19._0_8_ = x_sum;
  auVar19._12_4_ = 0x45300000;
  dVar9 = (((auVar19._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * centerx_sum -
          x_x_sum * x_angle_sum) / dVar7;
  auVar27._8_4_ = uVar23;
  auVar27._0_8_ = x_sum;
  auVar27._12_4_ = 0x45300000;
  auVar20._8_4_ = uVar23;
  auVar20._0_8_ = x_sum;
  auVar20._12_4_ = 0x45300000;
  dVar10 = (((auVar20._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * centery_sum -
           x_x_sum * x_centerx_sum) / dVar7;
  auVar28._8_4_ = uVar23;
  auVar28._0_8_ = x_sum;
  auVar28._12_4_ = 0x45300000;
  auVar21._8_4_ = uVar23;
  auVar21._0_8_ = x_sum;
  auVar21._12_4_ = 0x45300000;
  dVar7 = (((auVar21._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)) * (double)i -
          x_x_sum * x_centery_sum) / dVar7;
  auVar29._8_4_ = uVar23;
  auVar29._0_8_ = x_sum;
  auVar29._12_4_ = 0x45300000;
  x = 0.0;
  while( true ) {
    dVar5 = (double)std::array<cv::RotatedRect,_10UL>::size(__return_storage_ptr__);
    if ((ulong)dVar5 <= (ulong)x) break;
    auVar22._8_4_ = (int)((ulong)x >> 0x20);
    auVar22._0_8_ = x;
    auVar22._12_4_ = 0x45300000;
    dVar5 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(x,0)) - 4503599627370496.0)) * 0.5 + -0.5;
    cv::Point_<float>::Point_
              ((Point_<float> *)&size,
               (float)(dVar10 * dVar5 +
                      (x_centerx_sum - dVar10 * x_x_sum) /
                      ((auVar28._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0))),
               (float)(dVar7 * dVar5 +
                      (x_centery_sum - dVar7 * x_x_sum) /
                      ((auVar29._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0))));
    cv::Size_<float>::Size_
              ((Size_<float> *)&stack0xfffffffffffffef8,
               (float)(dVar8 * dVar5 +
                      (x_width_sum - dVar8 * x_x_sum) /
                      ((auVar26._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0))),
               (float)(dVar2 * dVar5 +
                      (x_height_sum - dVar2 * x_x_sum) /
                      ((auVar25._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0))));
    local_10c = (float)(dVar9 * dVar5 +
                       (x_angle_sum - dVar9 * x_x_sum) /
                       ((auVar27._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,uVar6) - 4503599627370496.0)));
    cv::RotatedRect::RotatedRect
              (&local_120,(Point2f *)&size,(Size2f *)&stack0xfffffffffffffef8,local_10c);
    this = std::array<cv::RotatedRect,_10UL>::operator[](__return_storage_ptr__,(size_type)x);
    cv::RotatedRect::operator=(this,&local_120);
    x = (double)((long)x + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::RotatedRect, 10> compute_final_ellipses_by_linear_interpolation(
    const std::array<cv::RotatedRect, 3>& ellipses, std::size_t ignored_index)
{
    std::array<cv::RotatedRect, 10> result = {};

    auto sample_size = ellipses.size();
    if(ignored_index < ellipses.size())
        sample_size--;

    double x_sum, x_x_sum, height_sum, x_height_sum, width_sum, x_width_sum, angle_sum, x_angle_sum, centerx_sum,
        x_centerx_sum, centery_sum, x_centery_sum;
    x_sum = x_x_sum = height_sum = x_height_sum = width_sum = x_width_sum = angle_sum = x_angle_sum = centerx_sum
        = x_centerx_sum = centery_sum = x_centery_sum = 0;

    for(std::size_t i = 0; i < ellipses.size(); i++)
    {
        if(i != ignored_index)
        {
            x_sum += i;
            x_x_sum += i * i;

            height_sum += ellipses[i].size.height;
            x_height_sum += i * double(ellipses[i].size.height);

            width_sum += ellipses[i].size.width;
            x_width_sum += i * double(ellipses[i].size.width);

            angle_sum += ellipses[i].angle;
            x_angle_sum += i * double(ellipses[i].angle);

            centerx_sum += ellipses[i].center.x;
            x_centerx_sum += i * double(ellipses[i].center.x);
            centery_sum += ellipses[i].center.y;
            x_centery_sum += i * double(ellipses[i].center.y);
        }
    }

    double x_square = (sample_size * x_x_sum - x_sum * x_sum);

    double height_coef = (sample_size * x_height_sum - x_sum * height_sum) / x_square;
    double height_constant = (height_sum - height_coef * x_sum) / sample_size;

    double width_coef = (sample_size * x_width_sum - x_sum * width_sum) / x_square;
    double width_constant = (width_sum - width_coef * x_sum) / sample_size;

    double angle_coef = (sample_size * x_angle_sum - x_sum * angle_sum) / x_square;
    double angle_constant = (angle_sum - angle_coef * x_sum) / sample_size;

    double centerx_coef = (sample_size * x_centerx_sum - x_sum * centerx_sum) / x_square;
    double centerx_constant = (centerx_sum - centerx_coef * x_sum) / sample_size;
    double centery_coef = (sample_size * x_centery_sum - x_sum * centery_sum) / x_square;
    double centery_constant = (centery_sum - centery_coef * x_sum) / sample_size;

    for(std::size_t i = 0; i < result.size(); i++)
    {
        auto x = i * 0.5 - 0.5;
        cv::Point2f center(float(centerx_coef * x + centerx_constant), float(centery_coef * x + centery_constant));
        cv::Size2f size(float(width_coef * x + width_constant), float(height_coef * x + height_constant));
        float angle = float(angle_coef * x + angle_constant);
        result[i] = cv::RotatedRect(center, size, angle);
    }

    return result;
}